

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-ctor-eval.cpp
# Opt level: O0

uint8_t __thiscall
anon_unknown.dwarf_51ae1::CtorEvalExternalInterface::load8u
          (CtorEvalExternalInterface *this,Address addr,Name memoryName)

{
  uchar uVar1;
  CtorEvalExternalInterface *this_local;
  Name memoryName_local;
  Address addr_local;
  
  uVar1 = doLoad<unsigned_char>(this,addr,memoryName);
  return uVar1;
}

Assistant:

uint8_t load8u(Address addr, Name memoryName) override {
    return doLoad<uint8_t>(addr, memoryName);
  }